

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_InvalidVariableCallThrows_Test::
~SemanticAnalyserTest_InvalidVariableCallThrows_Test
          (SemanticAnalyserTest_InvalidVariableCallThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_InvalidVariableCallThrows_Test
            ((SemanticAnalyserTest_InvalidVariableCallThrows_Test *)0x1e9418);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, InvalidVariableCallThrows)
{
  std::string source = R"SRC(  
  fn main(): f32
  {
    let x: f32 = 2*2 - 4;
    x(1, 2);
    ret 0;
  }
  )SRC";
  throwTest(source);
}